

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O0

uint32_t compute_all_addx_xcc(CPUSPARCState_conflict2 *env)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t ret;
  CPUSPARCState_conflict2 *env_local;
  
  uVar1 = get_NZ_xcc(env->cc_dst);
  uVar2 = get_C_addx_xcc(env->cc_dst,env->cc_src,env->cc_src2);
  uVar3 = get_V_add_xcc(env->cc_dst,env->cc_src,env->cc_src2);
  return uVar3 | uVar2 | uVar1;
}

Assistant:

static uint32_t compute_all_addx_xcc(CPUSPARCState *env)
{
    uint32_t ret;

    ret = get_NZ_xcc(CC_DST);
    ret |= get_C_addx_xcc(CC_DST, CC_SRC, CC_SRC2);
    ret |= get_V_add_xcc(CC_DST, CC_SRC, CC_SRC2);
    return ret;
}